

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O2

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* anon_unknown.dwarf_1aacf::getIDLBase
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,Type *type,IDLExport *exporter,string *field_name)

{
  string *name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__y;
  string type_name;
  IDLTypeIdentifierVisitor visitor;
  string local_160;
  string local_140;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 *local_c0;
  undefined8 local_b8;
  undefined1 local_b0 [16];
  undefined1 local_a0 [80];
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_c0 = local_b0;
  local_b8 = 0;
  local_a0._16_8_ = local_a0 + 0x20;
  local_a0._0_8_ = &PTR_visit__00125828;
  local_a0._24_8_ = 0;
  local_a0[0x20] = '\0';
  local_a0._48_8_ = local_a0 + 0x40;
  local_a0._56_8_ = 0;
  local_b0[0] = 0;
  local_a0[0x40] = '\0';
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_a0._8_8_ = exporter;
  Typelib::Type::getNamespace_abi_cxx11_();
  getIDLAbsoluteNamespace(&local_160,&local_140,(IDLExport *)local_a0._8_8_);
  std::__cxx11::string::operator=((string *)&local_50,(string *)&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_140);
  Typelib::TypeVisitor::apply((Type *)local_a0);
  name = (string *)(local_a0 + 0x10);
  normalizeIDLName(&local_160,name);
  std::__cxx11::string::operator=((string *)name,(string *)&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  if (field_name->_M_string_length == 0) {
    std::__cxx11::string::string((string *)&local_160,(string *)&local_50);
    std::operator+(&local_140,name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_a0 + 0x30));
    __y = &local_140;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,&local_160,__y);
  }
  else {
    std::__cxx11::string::string((string *)&local_160,(string *)&local_50);
    std::operator+(&local_100,name," ");
    stripLeadingUnderscore(&local_120,field_name);
    std::operator+(&local_e0,&local_100,&local_120);
    std::operator+(&local_140,&local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_a0 + 0x30));
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,&local_160,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_120);
    __y = &local_100;
  }
  std::__cxx11::string::~string((string *)__y);
  std::__cxx11::string::~string((string *)&local_160);
  IDLTypeIdentifierVisitor::~IDLTypeIdentifierVisitor((IDLTypeIdentifierVisitor *)local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  return __return_storage_ptr__;
}

Assistant:

static pair<string, string> getIDLBase(Type const& type, IDLExport const& exporter,
                                           std::string const& field_name = std::string())
    {
        std::string type_name;
        IDLTypeIdentifierVisitor visitor(exporter);

        visitor.apply(type);
        if (field_name.empty()) {
            return make_pair(visitor.getTargetNamespace(),
                             visitor.m_front + visitor.m_back);
        } else {
            return make_pair(visitor.getTargetNamespace(),
                             visitor.m_front + " " + stripLeadingUnderscore(field_name) +
                             visitor.m_back);
        }
    }